

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

string * __thiscall
pbrt::MitchellFilter::ToString_abi_cxx11_(string *__return_storage_ptr__,MitchellFilter *this)

{
  FilterSampler *unaff_RBX;
  
  StringPrintf<pbrt::Vector2<float>const&,float_const&,float_const&,pbrt::FilterSampler_const&>
            (__return_storage_ptr__,(pbrt *)"[ MitchellFilter radius: %s B: %f C: %f sampler: %s ]",
             (char *)this,(Vector2<float> *)&this->B,&this->C,(float *)&this->sampler,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string MitchellFilter::ToString() const {
    return StringPrintf("[ MitchellFilter radius: %s B: %f C: %f sampler: %s ]", radius,
                        B, C, sampler);
}